

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this)

{
  pointer ppBVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameCollaborativeGraphical_005a1438;
  ppBVar1 = (this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1;
  if (lVar2 != 0) {
    uVar3 = lVar2 >> 3;
    uVar4 = 1;
    uVar5 = 0;
    do {
      if (uVar3 <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (ppBVar1[uVar5] != (BayesianGameIdenticalPayoff *)0x0) {
        (**(code **)(*(long *)&(ppBVar1[uVar5]->super_BayesianGameIdenticalPayoffInterface).
                               super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure +
                    8))();
      }
      uVar5 = (ulong)uVar4;
      ppBVar1 = (this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->_m_LRFs).
                    super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar5);
  }
  if (this->_m_jt_pd != (PDDiscreteInterface *)0x0) {
    (**(code **)(*(long *)this->_m_jt_pd + 8))();
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_agentScopes);
  ppBVar1 = (this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar1 != (pointer)0x0) {
    operator_delete(ppBVar1,(long)(this->_m_LRFs).
                                  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar1
                   );
  }
  BayesianGameBase::~BayesianGameBase((BayesianGameBase *)this);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);

    if(_m_jt_pd)
        delete _m_jt_pd;
}